

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O3

void Mpm_ManPrepare(Mpm_Man_t *p)

{
  void *pvVar1;
  void **ppvVar2;
  int iVar3;
  Mpm_Cut_t *in_RAX;
  Mig_Man_t *pMVar4;
  uint *puVar5;
  ulong uVar6;
  uint uVar7;
  Mig_Obj_t *pMVar8;
  Mig_Fan_t MVar9;
  long lVar10;
  Mpm_Cut_t *local_38;
  
  pMVar4 = p->pMig;
  uVar7 = (pMVar4->vCis).nSize;
  uVar6 = (ulong)uVar7;
  if (0 < (int)uVar7) {
    lVar10 = 0;
    local_38 = in_RAX;
    do {
      if ((int)uVar6 <= lVar10) {
LAB_0040922a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar7 = (pMVar4->vCis).pArray[lVar10];
      if (((int)uVar7 < 0) || (pMVar4->nObjs <= (int)uVar7)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMig.h"
                      ,0x74,"Mig_Obj_t *Mig_ManObj(Mig_Man_t *, int)");
      }
      if ((pMVar4->vPages).nSize <= (int)(uVar7 >> 0xc)) goto LAB_00409268;
      pvVar1 = (pMVar4->vPages).pArray[uVar7 >> 0xc];
      if (pvVar1 == (void *)0x0) break;
      uVar6 = (ulong)((uVar7 & 0xfff) << 4);
      uVar7 = *(uint *)((long)pvVar1 + uVar6 + 0xc);
      iVar3 = Mpm_CutAlloc(p,1,&local_38);
      if (p->funcVar0 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf1,"int Abc_Var2Lit(int, int)");
      }
      puVar5 = (uint *)((long)pvVar1 + uVar6 + 0xc);
      *(uint *)&local_38->field_0x4 =
           (*(uint *)&local_38->field_0x4 & 0xfe000000) + (p->funcVar0 & 0xffffffU) * 2;
      local_38->pLeaves[0] = uVar7 & 0xfffffffe;
      uVar7 = *puVar5 >> 1;
      if ((p->vCutBests).nSize <= (int)uVar7) {
LAB_0040920b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (p->vCutBests).pArray[uVar7] = iVar3;
      uVar7 = *puVar5 >> 1;
      if ((p->vCutLists).nSize <= (int)uVar7) goto LAB_0040920b;
      (p->vCutLists).pArray[uVar7] = iVar3;
      lVar10 = lVar10 + 1;
      pMVar4 = p->pMig;
      uVar6 = (ulong)(pMVar4->vCis).nSize;
    } while (lVar10 < (long)uVar6);
  }
  pMVar4->iPage = 0;
  iVar3 = (pMVar4->vPages).nSize;
  if (0 < iVar3) {
    ppvVar2 = (pMVar4->vPages).pArray;
    uVar7 = 0;
    do {
      if ((int)uVar7 < 0) {
LAB_00409268:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pMVar8 = (Mig_Obj_t *)ppvVar2[uVar7];
      pMVar4->pPage = pMVar8;
      if (pMVar8 == (Mig_Obj_t *)0x0) {
        return;
      }
      MVar9 = pMVar8->pFans[3];
      if ((uint)MVar9 < 0xfffffffe) {
        do {
          if (((uint)pMVar8->pFans[1] < 0xfffffffe) ||
             (((uint)pMVar8->pFans[2] < 0xfffffffe && (0xfffffffd < (uint)pMVar8->pFans[0])))) {
            uVar7 = (uint)MVar9 >> 1;
            lVar10 = *(long *)((long)pMVar8 + (-0x10 - (ulong)((uVar7 & 0xfff) << 4)));
            if (*(int *)(lVar10 + 0x8c) <= (int)uVar7) goto LAB_0040922a;
            if ((p->vEstRefs).nSize <= (int)uVar7) goto LAB_0040920b;
            (p->vEstRefs).pArray[uVar7] =
                 *(int *)(*(long *)(lVar10 + 0x90) + (ulong)uVar7 * 4) * 100;
          }
          MVar9 = pMVar8[1].pFans[3];
          pMVar8 = pMVar8 + 1;
        } while ((uint)MVar9 < 0xfffffffe);
        iVar3 = (pMVar4->vPages).nSize;
        uVar7 = pMVar4->iPage;
      }
      uVar7 = uVar7 + 1;
      pMVar4->iPage = uVar7;
    } while ((int)uVar7 < iVar3);
  }
  return;
}

Assistant:

void Mpm_ManPrepare( Mpm_Man_t * p )
{
    Mig_Obj_t * pObj;
    int i, hCut;
    Mig_ManForEachCi( p->pMig, pObj, i )
    {
        hCut = Mpm_CutCreateUnit( p, Mig_ObjId(pObj) );
        Mpm_ObjSetCutBest( p, pObj, hCut );
        Mpm_ObjSetCutList( p, pObj, hCut );
    }
    Mig_ManForEachCand( p->pMig, pObj )
        Mpm_ObjSetEstRef( p, pObj, MPM_UNIT_REFS * Mig_ObjRefNum(pObj) );
}